

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

int QMessageBoxPrivate::showOldMessageBox
              (QWidget *parent,Icon icon,QString *title,QString *text,QString *button0Text,
              QString *button1Text,QString *button2Text,int defaultButtonNumber,
              int escapeButtonNumber)

{
  long lVar1;
  long *plVar2;
  char16_t *pcVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  undefined1 *puVar6;
  int iVar7;
  QMessageBox *this;
  QPushButton *button;
  QAbstractButton *button_00;
  long lVar8;
  long in_FS_OFFSET;
  QMessageBox messageBox;
  QArrayData *local_98;
  char16_t *pcStack_90;
  long local_88;
  QString local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QWidgetData *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QMessageBox::QMessageBox
            ((QMessageBox *)&local_58,icon,title,text,(StandardButtons)0x0,parent,(WindowFlags)0x103
            );
  local_78.d.d = (button0Text->d).d;
  local_78.d.ptr = (button0Text->d).ptr;
  local_78.d.size = (button0Text->d).size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_78.d.size == 0) {
    QMetaObject::tr((char *)&local_98,(char *)&QDialogButtonBox::staticMetaObject,0x6f3d12);
    pcVar3 = local_78.d.ptr;
    pDVar5 = local_78.d.d;
    lVar8 = local_88;
    pQVar4 = local_98;
    local_98 = &(local_78.d.d)->super_QArrayData;
    local_88 = local_78.d.size;
    local_78.d.d = (Data *)pQVar4;
    local_78.d.ptr = pcStack_90;
    pcStack_90 = pcVar3;
    local_78.d.size = lVar8;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
  }
  QMessageBox::addButton((QMessageBox *)&local_58,&local_78,ActionRole);
  if ((button1Text->d).size != 0) {
    QMessageBox::addButton((QMessageBox *)&local_58,button1Text,ActionRole);
  }
  if ((button2Text->d).size != 0) {
    QMessageBox::addButton((QMessageBox *)&local_58,button2Text,ActionRole);
  }
  puVar6 = puStack_50;
  if ((ulong)(long)defaultButtonNumber < *(ulong *)(puStack_50 + 0x310)) {
    button = *(QPushButton **)(*(long *)(puStack_50 + 0x308) + (long)defaultButtonNumber * 8);
  }
  else {
    button = (QPushButton *)0x0;
  }
  QMessageBox::setDefaultButton((QMessageBox *)&local_58,button);
  if ((ulong)(long)escapeButtonNumber < *(ulong *)(puVar6 + 0x310)) {
    button_00 = *(QAbstractButton **)(*(long *)(puVar6 + 0x308) + (long)escapeButtonNumber * 8);
  }
  else {
    button_00 = (QAbstractButton *)0x0;
  }
  this = (QMessageBox *)&local_58;
  QMessageBox::setEscapeButton(this,button_00);
  QDialog::exec((QDialog *)this);
  if (*(long *)(puVar6 + 0x310) != 0) {
    lVar8 = -8;
    do {
      iVar7 = (int)this;
      lVar1 = *(long *)(puVar6 + 0x310) * -8 + lVar8;
      if (lVar1 == -8) goto LAB_0050ddbb;
      this = (QMessageBox *)(lVar8 + 8);
      plVar2 = (long *)(lVar8 + *(long *)(puVar6 + 0x308) + 8);
      lVar8 = (long)this;
    } while (*plVar2 != *(long *)(puStack_50 + 0x330));
    iVar7 = (int)((long)this >> 3);
LAB_0050ddbb:
    if (lVar1 != -8) goto LAB_0050ddc8;
  }
  iVar7 = -1;
LAB_0050ddc8:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMessageBox::~QMessageBox((QMessageBox *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int QMessageBoxPrivate::showOldMessageBox(QWidget *parent, QMessageBox::Icon icon,
                                            const QString &title, const QString &text,
                                            const QString &button0Text,
                                            const QString &button1Text,
                                            const QString &button2Text,
                                            int defaultButtonNumber,
                                            int escapeButtonNumber)
{
    QMessageBox messageBox(icon, title, text, QMessageBox::NoButton, parent);
    QString myButton0Text = button0Text;
    if (myButton0Text.isEmpty())
        myButton0Text = QDialogButtonBox::tr("OK");
    messageBox.addButton(myButton0Text, QMessageBox::ActionRole);
    if (!button1Text.isEmpty())
        messageBox.addButton(button1Text, QMessageBox::ActionRole);
    if (!button2Text.isEmpty())
        messageBox.addButton(button2Text, QMessageBox::ActionRole);

    const QList<QAbstractButton *> &buttonList = messageBox.d_func()->customButtonList;
    messageBox.setDefaultButton(static_cast<QPushButton *>(buttonList.value(defaultButtonNumber)));
    messageBox.setEscapeButton(buttonList.value(escapeButtonNumber));

    messageBox.exec();

    // Ignore exec return value and use button index instead,
    // as that's what the documentation promises.
    return buttonList.indexOf(messageBox.clickedButton());
}